

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

long ConnectionKillOne(SessionHandle *data)

{
  connectdata *pcVar1;
  long lVar2;
  conncache *pcVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  timeval newer;
  
  newer = curlx_tvnow();
  pcVar3 = (data->state).connc;
  if (pcVar3 == (conncache *)0x0) {
    lVar6 = -1;
  }
  else {
    lVar5 = -1;
    lVar4 = 0;
    lVar6 = -1;
    do {
      if (pcVar3->num <= lVar4) goto LAB_0011deb5;
      pcVar1 = pcVar3->connects[lVar4];
      if ((pcVar1 != (connectdata *)0x0) && (pcVar1->inuse == false)) {
        lVar2 = curlx_tvdiff(newer,pcVar1->now);
        if (lVar5 < lVar2) {
          lVar5 = lVar2;
          lVar6 = lVar4;
        }
        pcVar3 = (data->state).connc;
      }
      lVar4 = lVar4 + 1;
    } while (pcVar3 != (conncache *)0x0);
    pcVar3 = (conncache *)0x0;
LAB_0011deb5:
    if (-1 < lVar6) {
      pcVar1 = pcVar3->connects[lVar6];
      pcVar1->data = data;
      Curl_disconnect(pcVar1,false);
      ((data->state).connc)->connects[lVar6] = (connectdata *)0x0;
    }
  }
  return lVar6;
}

Assistant:

static long
ConnectionKillOne(struct SessionHandle *data)
{
  long i;
  struct connectdata *conn;
  long highscore=-1;
  long connindex=-1;
  long score;
  struct timeval now;

  now = Curl_tvnow();

  for(i=0; data->state.connc && (i< data->state.connc->num); i++) {
    conn = data->state.connc->connects[i];

    if(!conn || conn->inuse)
      continue;

    /* Set higher score for the age passed since the connection was used */
    score = Curl_tvdiff(now, conn->now);

    if(score > highscore) {
      highscore = score;
      connindex = i;
    }
  }
  if(connindex >= 0) {
    /* Set the connection's owner correctly */
    conn = data->state.connc->connects[connindex];
    conn->data = data;

    /* the winner gets the honour of being disconnected */
    (void)Curl_disconnect(conn, /* dead_connection */ FALSE);

    /* clean the array entry */
    data->state.connc->connects[connindex] = NULL;
  }

  return connindex; /* return the available index or -1 */
}